

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O2

fy_iter_chunk * fy_token_iter_chunk_next(fy_token_iter *iter,fy_iter_chunk *curr,int *errp)

{
  fy_iter_chunk *pfVar1;
  
  if (iter != (fy_token_iter *)0x0) {
    if (errp != (int *)0x0) {
      *errp = 0;
    }
    pfVar1 = &iter->ic;
    if (curr == (fy_iter_chunk *)0x0) {
      if (pfVar1->str != (char *)0x0) {
        if ((iter->ic).len == 0) {
          pfVar1 = (fy_iter_chunk *)0x0;
        }
        return pfVar1;
      }
      pfVar1 = fy_atom_iter_chunk_next(&iter->atom_iter,(fy_iter_chunk *)0x0,errp);
      return pfVar1;
    }
    if (pfVar1 != curr) {
      pfVar1 = fy_atom_iter_chunk_next(&iter->atom_iter,curr,errp);
      return pfVar1;
    }
    (iter->ic).str = (iter->ic).str + (iter->ic).len;
    (iter->ic).len = 0;
  }
  return (fy_iter_chunk *)0x0;
}

Assistant:

const struct fy_iter_chunk *
fy_token_iter_chunk_next(struct fy_token_iter *iter, const struct fy_iter_chunk *curr, int *errp) {
    if (!iter)
        return NULL;

    if (errp)
        *errp = 0;

    /* first time in */
    if (!curr) {
        if (iter->ic.str)
            return iter->ic.len ? &iter->ic : NULL;
        return fy_atom_iter_chunk_next(&iter->atom_iter, NULL, errp);
    }

    /* direct, all consumed */
    if (curr == &iter->ic) {
        iter->ic.str += iter->ic.len;
        iter->ic.len = 0;
        return NULL;
    }

    /* fallback */
    return fy_atom_iter_chunk_next(&iter->atom_iter, curr, errp);
}